

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O0

void __thiscall
CreateCharacterState::processSelectCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  bool bVar1;
  int id;
  ostream *poVar2;
  element_type *this_00;
  mapped_type *pmVar3;
  element_type *peVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  element_type *peVar9;
  element_type *peVar10;
  string *psVar11;
  GameStates local_3a2;
  shared_ptr<Connection> local_3a0;
  allocator local_389;
  string local_388 [32];
  string local_368 [32];
  undefined1 local_348 [8];
  shared_ptr<Player> player;
  string character;
  shared_ptr<Connection> local_318;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  string local_2b8 [36];
  int local_294;
  undefined1 local_290 [4];
  int selection;
  Account local_270;
  undefined1 local_228 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  characters;
  shared_ptr<Connection> local_208;
  string local_1f8 [48];
  _Base_ptr local_1c8;
  pair<const_int,_std::shared_ptr<Race>_> *race;
  iterator __end2;
  iterator __begin2;
  map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
  *__range2;
  stringstream ss;
  ostream local_198 [376];
  shared_ptr<Connection> *local_20;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  CreateCharacterState *this_local;
  
  local_20 = connection;
  connection_local = (shared_ptr<Connection> *)input;
  input_local = (string *)this;
  bVar1 = std::operator==(input,"N");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              connection_local,"n"), bVar1)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
    __end2 = std::
             map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
             ::begin(&this->m_race_map);
    race = (pair<const_int,_std::shared_ptr<Race>_> *)
           std::
           map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
           ::end(&this->m_race_map);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&race), bVar1) {
      local_1c8 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Race>_>_>::operator*
                            (&__end2);
      poVar2 = (ostream *)std::ostream::operator<<(local_198,local_1c8->_M_color);
      poVar2 = std::operator<<(poVar2," ");
      this_00 = std::__shared_ptr_access<Race,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Race,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           &local_1c8->_M_parent);
      psVar11 = Race::getRace_name_abi_cxx11_(this_00);
      poVar2 = std::operator<<(poVar2,(string *)psVar11);
      std::operator<<(poVar2,"\r\n");
      std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Race>_>_>::operator++(&__end2);
    }
    std::operator<<(local_198,"Choose a race\r\n");
    std::__cxx11::stringstream::str();
    std::shared_ptr<Connection>::shared_ptr(&local_208,connection);
    Sender::Send(local_1f8,&local_208);
    std::shared_ptr<Connection>::~shared_ptr(&local_208);
    std::__cxx11::string::~string((string *)local_1f8);
    peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)connection);
    characters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Connection::GetID(peVar10);
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_state_map,
                        (key_type *)
                        ((long)&characters.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    *pmVar3 = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  }
  else {
    peVar4 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_GameState).game_data);
    std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               connection);
    Connection::GetUsername_abi_cxx11_((Connection *)local_290);
    GameData::GetAccount(&local_270,peVar4,(string *)local_290);
    Account::GetCharacters_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_228,&local_270);
    Account::~Account(&local_270);
    std::__cxx11::string::~string((string *)local_290);
    local_294 = 0;
    std::__cxx11::string::string(local_2b8,(string *)connection_local);
    bVar1 = Utils::IsNumber((string *)local_2b8);
    std::__cxx11::string::~string(local_2b8);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,pcVar5,&local_2d9);
      local_294 = std::__cxx11::stoi((string *)local_2d8,(size_t *)0x0,10);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    }
    if ((local_294 < 1) ||
       (uVar6 = (ulong)local_294,
       sVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_228), sVar7 < uVar6)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"Invalid Selection\n",&local_301);
      std::shared_ptr<Connection>::shared_ptr(&local_318,connection);
      Sender::Send((string *)local_300,&local_318);
      std::shared_ptr<Connection>::~shared_ptr(&local_318);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
    }
    else {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_228,(long)(local_294 + -1));
      std::__cxx11::string::string
                ((string *)
                 &player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (string *)pvVar8);
      peVar4 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&(this->super_GameState).game_data);
      std::__cxx11::string::string
                (local_368,
                 (string *)
                 &player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      GameData::GetPlayer((GameData *)local_348,(string *)peVar4);
      std::__cxx11::string::~string(local_368);
      peVar9 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_348);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      id = Connection::GetID(peVar10);
      Player::SetID(peVar9,id);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      Connection::SetPlayer(peVar10,(shared_ptr<Player> *)local_348);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      peVar9 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_348);
      psVar11 = Player::GetPlayerName_abi_cxx11_(peVar9);
      Connection::SetCharacterName(peVar10,psVar11);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      peVar9 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_348);
      psVar11 = Player::GetPlayerClass_abi_cxx11_(peVar9);
      Connection::SetCharacterClass(peVar10,psVar11);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      peVar9 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_348);
      psVar11 = Player::GetPlayerRaceStr_abi_cxx11_(peVar9);
      Connection::SetCharacterRace(peVar10,psVar11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"Character Selected\r\n",&local_389);
      std::shared_ptr<Connection>::shared_ptr(&local_3a0,connection);
      Sender::Send((string *)local_388,&local_3a0);
      std::shared_ptr<Connection>::~shared_ptr(&local_3a0);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
      peVar10 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)connection);
      local_3a2 = PLAYING;
      Connection::SetState(peVar10,&local_3a2,&(this->super_GameState).game_data);
      std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_348);
      std::__cxx11::string::~string
                ((string *)
                 &player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  }
  return;
}

Assistant:

void CreateCharacterState::processSelectCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    if(input == "N" or input == "n") {
        std::stringstream ss;
        for(const auto& race : m_race_map)
        {
            ss << race.first << " " << race.second->getRace_name() << "\r\n";
        }
        ss << "Choose a race\r\n";
        Sender::Send(ss.str(), connection);
        m_state_map[connection->GetID()] = CHOOSE_RACE;
    }
    else {
        // validate entry
        auto characters = game_data->GetAccount(connection->GetUsername()).GetCharacters();
        int selection = 0;
        if(Utils::IsNumber(input))
            selection = std::stoi(input.c_str());
        if(selection < 1 or selection > characters.size())
        {
            Sender::Send("Invalid Selection\n", connection);
        }
        else {
            std::string character = characters[selection - 1];
            std::shared_ptr<Player> player = game_data->GetPlayer(character);
            player->SetID(connection->GetID());
            connection->SetPlayer(player);
            connection->SetCharacterName(player->GetPlayerName());
            connection->SetCharacterClass(player->GetPlayerClass());
            connection->SetCharacterRace(player->GetPlayerRaceStr());
            Sender::Send("Character Selected\r\n", connection);
            connection->SetState(GameStates::PLAYING, game_data);
        }
    }
}